

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

char * tcg_get_arg_str_ptr(TCGContext_conflict9 *s,char *buf,int buf_size,TCGTemp *ts)

{
  size_t sVar1;
  int idx;
  TCGTemp *ts_local;
  int buf_size_local;
  char *buf_local;
  TCGContext_conflict9 *s_local;
  
  sVar1 = temp_idx(s,ts);
  if ((*(ulong *)ts >> 0x25 & 1) == 0) {
    if ((*(ulong *)ts >> 0x26 & 1) == 0) {
      snprintf(buf,(long)buf_size,"tmp%d",(ulong)(uint)((int)sVar1 - s->nb_globals));
    }
    else {
      snprintf(buf,(long)buf_size,"loc%d",(ulong)(uint)((int)sVar1 - s->nb_globals));
    }
  }
  else {
    pstrcpy(buf,buf_size,ts->name);
  }
  return buf;
}

Assistant:

static char *tcg_get_arg_str_ptr(TCGContext *s, char *buf, int buf_size,
                                 TCGTemp *ts)
{
    int idx = temp_idx(s, ts);

    if (ts->temp_global) {
        pstrcpy(buf, buf_size, ts->name);
    } else if (ts->temp_local) {
        snprintf(buf, buf_size, "loc%d", idx - s->nb_globals);
    } else {
        snprintf(buf, buf_size, "tmp%d", idx - s->nb_globals);
    }
    return buf;
}